

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_variables.cpp
# Opt level: O2

void duckdb::DuckDBVariablesFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  reference pvVar2;
  _func_int **pp_Var3;
  _func_int **__n;
  _func_int **pp_Var4;
  ulong index;
  string local_d0;
  string local_b0;
  string local_90;
  Value local_70;
  
  pGVar1 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  __n = pGVar1[4]._vptr_GlobalTableFunctionState;
  pp_Var4 = pGVar1[1]._vptr_GlobalTableFunctionState;
  pp_Var3 = pGVar1[2]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)(((long)pp_Var3 - (long)pp_Var4) / 0x60)) {
    for (index = 0;
        (__n < (_func_int **)(((long)pp_Var3 - (long)pp_Var4) / 0x60) && (index < 0x800));
        index = index + 1) {
      pGVar1[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
      pvVar2 = vector<duckdb::VariableData,_true>::get<true>
                         ((vector<duckdb::VariableData,_true> *)(pGVar1 + 1),(size_type)__n);
      ::std::__cxx11::string::string((string *)&local_b0,(string *)pvVar2);
      Value::Value(&local_70,&local_b0);
      DataChunk::SetValue(output,0,index,&local_70);
      Value::~Value(&local_70);
      ::std::__cxx11::string::~string((string *)&local_b0);
      Value::ToString_abi_cxx11_(&local_90,&pvVar2->value);
      Value::Value(&local_70,&local_90);
      DataChunk::SetValue(output,1,index,&local_70);
      Value::~Value(&local_70);
      ::std::__cxx11::string::~string((string *)&local_90);
      LogicalType::ToString_abi_cxx11_(&local_d0,&(pvVar2->value).type_);
      Value::Value(&local_70,&local_d0);
      DataChunk::SetValue(output,2,index,&local_70);
      Value::~Value(&local_70);
      ::std::__cxx11::string::~string((string *)&local_d0);
      __n = pGVar1[4]._vptr_GlobalTableFunctionState;
      pp_Var4 = pGVar1[1]._vptr_GlobalTableFunctionState;
      pp_Var3 = pGVar1[2]._vptr_GlobalTableFunctionState;
    }
    output->count = index;
  }
  return;
}

Assistant:

void DuckDBVariablesFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBVariablesData>();
	if (data.offset >= data.variables.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.variables.size() && count < STANDARD_VECTOR_SIZE) {
		auto &variable_entry = data.variables[data.offset++];

		// return values:
		idx_t col = 0;
		// name, VARCHAR
		output.SetValue(col++, count, Value(variable_entry.name));
		// value, BIGINT
		output.SetValue(col++, count, Value(variable_entry.value.ToString()));
		// type, VARCHAR
		output.SetValue(col, count, Value(variable_entry.value.type().ToString()));
		count++;
	}
	output.SetCardinality(count);
}